

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha256-ni.c
# Opt level: O0

void sha256_ni_digest(ssh_hash *hash,uint8_t *digest)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  __m128i *output;
  __m128i mask;
  __m128i hgfe;
  __m128i dcba;
  __m128i dchg;
  __m128i feba;
  sha256_ni *s;
  uint8_t *digest_local;
  ssh_hash *hash_local;
  
  sha256_block_pad((sha256_block *)(hash + -7),(BinarySink *)&hash[-2].binarysink_);
  uVar1 = *(undefined4 *)((long)&hash[-9].vt + 4);
  uVar2 = *(undefined4 *)((long)&hash[-9].binarysink_ + 4);
  auVar8._4_4_ = *(undefined4 *)&hash[-9].binarysink_;
  auVar8._0_4_ = uVar2;
  auVar8._8_4_ = uVar1;
  auVar8._12_4_ = *(undefined4 *)&hash[-9].vt;
  auVar7._4_4_ = *(undefined4 *)&hash[-8].vt;
  auVar7._0_4_ = *(undefined4 *)((long)&hash[-8].vt + 4);
  auVar7._8_4_ = *(undefined4 *)((long)&hash[-8].binarysink_ + 4);
  auVar7._12_4_ = *(undefined4 *)&hash[-8].binarysink_;
  auVar7 = pblendw(auVar8,auVar7,0xf0);
  auVar6._4_4_ = *(undefined4 *)&hash[-9].binarysink_;
  auVar6._0_4_ = uVar2;
  auVar4._12_4_ = *(undefined4 *)&hash[-9].vt;
  auVar4._8_4_ = uVar1;
  dcba[0] = auVar7._8_8_;
  auVar6._8_8_ = dcba[0];
  auVar5._8_8_ = 0xc0d0e0f08090a0b;
  auVar5._0_8_ = 0x405060700010203;
  auVar7 = pshufb(auVar6,auVar5);
  auVar4._0_8_ = mask[1];
  auVar3._8_8_ = 0xc0d0e0f08090a0b;
  auVar3._0_8_ = 0x405060700010203;
  auVar8 = pshufb(auVar4,auVar3);
  hgfe[1] = auVar7._0_8_;
  dcba[0] = auVar7._8_8_;
  *(longlong *)digest = hgfe[1];
  *(longlong *)(digest + 8) = dcba[0];
  mask[1] = auVar8._0_8_;
  hgfe[0] = auVar8._8_8_;
  *(longlong *)(digest + 0x10) = mask[1];
  *(longlong *)(digest + 0x18) = hgfe[0];
  return;
}

Assistant:

static void sha256_ni_digest(ssh_hash *hash, uint8_t *digest)
{
    sha256_ni *s = container_of(hash, sha256_ni, hash);

    sha256_block_pad(&s->blk, BinarySink_UPCAST(s));

    /* Rearrange the words into the output order */
    __m128i feba = _mm_shuffle_epi32(s->core[0], 0x1B);
    __m128i dchg = _mm_shuffle_epi32(s->core[1], 0xB1);
    __m128i dcba = _mm_blend_epi16(feba, dchg, 0xF0);
    __m128i hgfe = _mm_alignr_epi8(dchg, feba, 8);

    /* Byte-swap them into the output endianness */
    const __m128i mask = _mm_setr_epi8(3,2,1,0,7,6,5,4,11,10,9,8,15,14,13,12);
    dcba = _mm_shuffle_epi8(dcba, mask);
    hgfe = _mm_shuffle_epi8(hgfe, mask);

    /* And store them */
    __m128i *output = (__m128i *)digest;
    _mm_storeu_si128(output, dcba);
    _mm_storeu_si128(output+1, hgfe);
}